

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

InterpolationRange *
tcu::anon_unknown_3::calcTriangleInterpolationWeights
          (InterpolationRange *__return_storage_ptr__,Vec4 *p0,Vec4 *p1,Vec4 *p2,Vec2 *ndpixel)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float minDivisor;
  float maxDivisor;
  float minPreDivisionValues [3];
  float maxPreDivisionValues [3];
  float kcMin;
  float kbMin;
  float kaMin;
  float kcMax;
  float kbMax;
  float kaMax;
  float kc;
  float kb;
  float ka;
  Vec2 local_64;
  Vec2 nd2;
  Vec2 local_54;
  Vec2 nd1;
  Vec2 local_44;
  Vec2 nd0;
  int divError;
  int barycentricError;
  int roundError;
  Vec2 *ndpixel_local;
  Vec4 *p2_local;
  Vec4 *p1_local;
  Vec4 *p0_local;
  InterpolationRange *returnValue;
  
  nd0.m_data[1] = 4.2039e-45;
  nd0.m_data[0] = 1.12104e-44;
  Vector<float,_4>::swizzle((Vector<float,_4> *)&nd1,(int)p0,0);
  fVar2 = Vector<float,_4>::w(p0);
  tcu::operator/((tcu *)&local_44,&nd1,fVar2);
  Vector<float,_4>::swizzle((Vector<float,_4> *)&nd2,(int)p1,0);
  fVar2 = Vector<float,_4>::w(p1);
  tcu::operator/((tcu *)&local_54,&nd2,fVar2);
  Vector<float,_4>::swizzle((Vector<float,_4> *)&kb,(int)p2,0);
  fVar2 = Vector<float,_4>::w(p2);
  tcu::operator/((tcu *)&local_64,(Vector<float,_2> *)&kb,fVar2);
  fVar2 = triangleArea(ndpixel,&local_54,&local_64);
  fVar3 = triangleArea(ndpixel,&local_64,&local_44);
  fVar4 = triangleArea(ndpixel,&local_44,&local_54);
  fVar5 = getMaxValueWithinError(fVar2,3);
  fVar5 = getMaxFlushToZero(fVar5);
  fVar6 = getMaxValueWithinError(fVar3,3);
  fVar6 = getMaxFlushToZero(fVar6);
  fVar7 = getMaxValueWithinError(fVar4,3);
  fVar7 = getMaxFlushToZero(fVar7);
  fVar2 = getMinValueWithinError(fVar2,3);
  fVar2 = getMinFlushToZero(fVar2);
  fVar3 = getMinValueWithinError(fVar3,3);
  fVar3 = getMinFlushToZero(fVar3);
  fVar4 = getMinValueWithinError(fVar4,3);
  fVar4 = getMinFlushToZero(fVar4);
  fVar8 = Vector<float,_4>::w(p0);
  fVar5 = getMaxFlushToZero(fVar5 / fVar8);
  fVar5 = getMaxValueWithinError(fVar5,8);
  fVar5 = getMaxFlushToZero(fVar5);
  fVar8 = Vector<float,_4>::w(p1);
  fVar6 = getMaxFlushToZero(fVar6 / fVar8);
  fVar6 = getMaxValueWithinError(fVar6,8);
  fVar6 = getMaxFlushToZero(fVar6);
  fVar8 = Vector<float,_4>::w(p2);
  fVar7 = getMaxFlushToZero(fVar7 / fVar8);
  fVar7 = getMaxValueWithinError(fVar7,8);
  fVar7 = getMaxFlushToZero(fVar7);
  fVar8 = Vector<float,_4>::w(p0);
  fVar2 = getMinFlushToZero(fVar2 / fVar8);
  fVar2 = getMinValueWithinError(fVar2,8);
  fVar2 = getMinFlushToZero(fVar2);
  fVar8 = Vector<float,_4>::w(p1);
  fVar3 = getMinFlushToZero(fVar3 / fVar8);
  fVar3 = getMinValueWithinError(fVar3,8);
  fVar3 = getMinFlushToZero(fVar3);
  fVar8 = Vector<float,_4>::w(p2);
  fVar4 = getMinFlushToZero(fVar4 / fVar8);
  fVar4 = getMinValueWithinError(fVar4,8);
  fVar4 = getMinFlushToZero(fVar4);
  fVar8 = getMaxValueWithinError(fVar5 + fVar6 + fVar7,2);
  fVar8 = getMaxFlushToZero(fVar8);
  fVar9 = getMinValueWithinError(fVar2 + fVar3 + fVar4,2);
  fVar9 = getMinFlushToZero(fVar9);
  InterpolationRange::InterpolationRange(__return_storage_ptr__);
  fVar10 = maximalRangeDivision(fVar2,fVar5,fVar9,fVar8);
  fVar10 = getMaxFlushToZero(fVar10);
  fVar10 = getMaxValueWithinError(fVar10,8);
  fVar10 = getMaxFlushToZero(fVar10);
  pfVar1 = Vector<float,_3>::x(&__return_storage_ptr__->max);
  *pfVar1 = fVar10;
  fVar10 = maximalRangeDivision(fVar3,fVar6,fVar9,fVar8);
  fVar10 = getMaxFlushToZero(fVar10);
  fVar10 = getMaxValueWithinError(fVar10,8);
  fVar10 = getMaxFlushToZero(fVar10);
  pfVar1 = Vector<float,_3>::y(&__return_storage_ptr__->max);
  *pfVar1 = fVar10;
  fVar10 = maximalRangeDivision(fVar4,fVar7,fVar9,fVar8);
  fVar10 = getMaxFlushToZero(fVar10);
  fVar10 = getMaxValueWithinError(fVar10,8);
  fVar10 = getMaxFlushToZero(fVar10);
  pfVar1 = Vector<float,_3>::z(&__return_storage_ptr__->max);
  *pfVar1 = fVar10;
  fVar2 = minimalRangeDivision(fVar2,fVar5,fVar9,fVar8);
  fVar2 = getMinFlushToZero(fVar2);
  fVar2 = getMinValueWithinError(fVar2,8);
  fVar2 = getMinFlushToZero(fVar2);
  pfVar1 = Vector<float,_3>::x(&__return_storage_ptr__->min);
  *pfVar1 = fVar2;
  fVar2 = minimalRangeDivision(fVar3,fVar6,fVar9,fVar8);
  fVar2 = getMinFlushToZero(fVar2);
  fVar2 = getMinValueWithinError(fVar2,8);
  fVar2 = getMinFlushToZero(fVar2);
  pfVar1 = Vector<float,_3>::y(&__return_storage_ptr__->min);
  *pfVar1 = fVar2;
  fVar2 = minimalRangeDivision(fVar4,fVar7,fVar9,fVar8);
  fVar2 = getMinFlushToZero(fVar2);
  fVar2 = getMinValueWithinError(fVar2,8);
  fVar2 = getMinFlushToZero(fVar2);
  pfVar1 = Vector<float,_3>::z(&__return_storage_ptr__->min);
  *pfVar1 = fVar2;
  return __return_storage_ptr__;
}

Assistant:

InterpolationRange calcTriangleInterpolationWeights (const tcu::Vec4& p0, const tcu::Vec4& p1, const tcu::Vec4& p2, const tcu::Vec2& ndpixel)
{
	const int roundError		= 1;
	const int barycentricError	= 3;
	const int divError			= 8;

	const tcu::Vec2 nd0 = p0.swizzle(0, 1) / p0.w();
	const tcu::Vec2 nd1 = p1.swizzle(0, 1) / p1.w();
	const tcu::Vec2 nd2 = p2.swizzle(0, 1) / p2.w();

	const float ka = triangleArea(ndpixel, nd1, nd2);
	const float kb = triangleArea(ndpixel, nd2, nd0);
	const float kc = triangleArea(ndpixel, nd0, nd1);

	const float kaMax = getMaxFlushToZero(getMaxValueWithinError(ka, barycentricError));
	const float kbMax = getMaxFlushToZero(getMaxValueWithinError(kb, barycentricError));
	const float kcMax = getMaxFlushToZero(getMaxValueWithinError(kc, barycentricError));
	const float kaMin = getMinFlushToZero(getMinValueWithinError(ka, barycentricError));
	const float kbMin = getMinFlushToZero(getMinValueWithinError(kb, barycentricError));
	const float kcMin = getMinFlushToZero(getMinValueWithinError(kc, barycentricError));
	DE_ASSERT(kaMin <= kaMax);
	DE_ASSERT(kbMin <= kbMax);
	DE_ASSERT(kcMin <= kcMax);

	// calculate weights: vec3(ka / p0.w, kb / p1.w, kc / p2.w) / (ka / p0.w + kb / p1.w + kc / p2.w)
	const float maxPreDivisionValues[3] =
	{
		getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(kaMax / p0.w()), divError)),
		getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(kbMax / p1.w()), divError)),
		getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(kcMax / p2.w()), divError)),
	};
	const float minPreDivisionValues[3] =
	{
		getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(kaMin / p0.w()), divError)),
		getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(kbMin / p1.w()), divError)),
		getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(kcMin / p2.w()), divError)),
	};
	DE_ASSERT(minPreDivisionValues[0] <= maxPreDivisionValues[0]);
	DE_ASSERT(minPreDivisionValues[1] <= maxPreDivisionValues[1]);
	DE_ASSERT(minPreDivisionValues[2] <= maxPreDivisionValues[2]);

	const float maxDivisor = getMaxFlushToZero(getMaxValueWithinError(maxPreDivisionValues[0] + maxPreDivisionValues[1] + maxPreDivisionValues[2], 2*roundError));
	const float minDivisor = getMinFlushToZero(getMinValueWithinError(minPreDivisionValues[0] + minPreDivisionValues[1] + minPreDivisionValues[2], 2*roundError));
	DE_ASSERT(minDivisor <= maxDivisor);

	InterpolationRange returnValue;

	returnValue.max.x() = getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(maximalRangeDivision(minPreDivisionValues[0], maxPreDivisionValues[0], minDivisor, maxDivisor)), divError));
	returnValue.max.y() = getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(maximalRangeDivision(minPreDivisionValues[1], maxPreDivisionValues[1], minDivisor, maxDivisor)), divError));
	returnValue.max.z() = getMaxFlushToZero(getMaxValueWithinError(getMaxFlushToZero(maximalRangeDivision(minPreDivisionValues[2], maxPreDivisionValues[2], minDivisor, maxDivisor)), divError));
	returnValue.min.x() = getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(minimalRangeDivision(minPreDivisionValues[0], maxPreDivisionValues[0], minDivisor, maxDivisor)), divError));
	returnValue.min.y() = getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(minimalRangeDivision(minPreDivisionValues[1], maxPreDivisionValues[1], minDivisor, maxDivisor)), divError));
	returnValue.min.z() = getMinFlushToZero(getMinValueWithinError(getMinFlushToZero(minimalRangeDivision(minPreDivisionValues[2], maxPreDivisionValues[2], minDivisor, maxDivisor)), divError));

	DE_ASSERT(returnValue.min.x() <= returnValue.max.x());
	DE_ASSERT(returnValue.min.y() <= returnValue.max.y());
	DE_ASSERT(returnValue.min.z() <= returnValue.max.z());

	return returnValue;
}